

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

bool re2::Regexp::Equal(Regexp *a,Regexp *b)

{
  Regexp *pRVar1;
  Regexp *pRVar2;
  bool bVar3;
  RegexpOp RVar4;
  int iVar5;
  size_type sVar6;
  reference ppRVar7;
  Regexp *in_RSI;
  Regexp *in_RDI;
  size_t n;
  int i;
  Regexp *b2;
  Regexp *a2;
  vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> stk;
  Regexp *in_stack_000001a0;
  Regexp *in_stack_000001a8;
  Regexp **in_stack_ffffffffffffff68;
  vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *in_stack_ffffffffffffff80;
  int local_50;
  vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> local_30;
  Regexp *local_18;
  Regexp *local_10;
  byte local_1;
  
  if ((in_RDI == (Regexp *)0x0) || (in_RSI == (Regexp *)0x0)) {
    local_1 = in_RDI == in_RSI;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    bVar3 = TopEqual(in_stack_000001a8,in_stack_000001a0);
    if (bVar3) {
      RVar4 = op(local_10);
      if (RVar4 - kRegexpConcat < 7) {
        std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::vector
                  ((vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *)0x20a7a4);
        pRVar2 = local_18;
        pRVar1 = local_10;
        do {
          while (local_10 = pRVar1, local_18 = pRVar2, RVar4 = op(local_10),
                RVar4 - kRegexpConcat < 2) {
            for (local_50 = 0; iVar5 = nsub(local_10), local_50 < iVar5; local_50 = local_50 + 1) {
              sub(local_10);
              in_stack_ffffffffffffff80 =
                   (vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *)sub(local_18);
              in_stack_ffffffffffffff7f = TopEqual(in_stack_000001a8,in_stack_000001a0);
              if (!(bool)in_stack_ffffffffffffff7f) {
                local_1 = 0;
                goto LAB_0020a9fc;
              }
              std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::push_back
                        (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
              std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::push_back
                        (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
            }
LAB_0020a97c:
            sVar6 = std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::size(&local_30);
            if (sVar6 == 0) {
              local_1 = 1;
              goto LAB_0020a9fc;
            }
            ppRVar7 = std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::operator[]
                                (&local_30,sVar6 - 2);
            local_10 = *ppRVar7;
            ppRVar7 = std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::operator[]
                                (&local_30,sVar6 - 1);
            local_18 = *ppRVar7;
            std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::resize
                      (in_stack_ffffffffffffff80,
                       CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
            pRVar2 = local_18;
            pRVar1 = local_10;
          }
          if (4 < RVar4 - kRegexpStar) goto LAB_0020a97c;
          in_stack_ffffffffffffff70 =
               (vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *)sub(local_10);
          pRVar1 = (Regexp *)
                   (in_stack_ffffffffffffff70->
                   super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          in_stack_ffffffffffffff68 = sub(local_18);
          pRVar2 = *in_stack_ffffffffffffff68;
          bVar3 = TopEqual(in_stack_000001a8,in_stack_000001a0);
        } while (bVar3);
        local_1 = 0;
LAB_0020a9fc:
        std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::~vector
                  (in_stack_ffffffffffffff70);
      }
      else {
        local_1 = 1;
      }
    }
    else {
      local_1 = 0;
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Regexp::Equal(Regexp* a, Regexp* b) {
  if (a == NULL || b == NULL)
    return a == b;

  if (!TopEqual(a, b))
    return false;

  // Fast path:
  // return without allocating vector if there are no subregexps.
  switch (a->op()) {
    case kRegexpAlternate:
    case kRegexpConcat:
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
    case kRegexpRepeat:
    case kRegexpCapture:
      break;

    default:
      return true;
  }

  // Committed to doing real work.
  // The stack (vector) has pairs of regexps waiting to
  // be compared.  The regexps are only equal if
  // all the pairs end up being equal.
  std::vector<Regexp*> stk;

  for (;;) {
    // Invariant: TopEqual(a, b) == true.
    Regexp* a2;
    Regexp* b2;
    switch (a->op()) {
      default:
        break;
      case kRegexpAlternate:
      case kRegexpConcat:
        for (int i = 0; i < a->nsub(); i++) {
          a2 = a->sub()[i];
          b2 = b->sub()[i];
          if (!TopEqual(a2, b2))
            return false;
          stk.push_back(a2);
          stk.push_back(b2);
        }
        break;

      case kRegexpStar:
      case kRegexpPlus:
      case kRegexpQuest:
      case kRegexpRepeat:
      case kRegexpCapture:
        a2 = a->sub()[0];
        b2 = b->sub()[0];
        if (!TopEqual(a2, b2))
          return false;
        // Really:
        //   stk.push_back(a2);
        //   stk.push_back(b2);
        //   break;
        // but faster to assign directly and loop.
        a = a2;
        b = b2;
        continue;
    }

    size_t n = stk.size();
    if (n == 0)
      break;

    DCHECK_GE(n, 2);
    a = stk[n-2];
    b = stk[n-1];
    stk.resize(n-2);
  }

  return true;
}